

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O1

void __thiscall
amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
          (FabArray<amrex::FArrayBox> *this,int scomp,int ncomp,IntVect *nghost,Periodicity *period,
          bool cross)

{
  undefined8 uVar1;
  int iVar2;
  
  uVar1 = *(undefined8 *)(this->super_FabArrayBase).n_grow.vect;
  if ((((int)uVar1 < nghost->vect[0]) || ((int)((ulong)uVar1 >> 0x20) < nghost->vect[1])) ||
     ((this->super_FabArrayBase).n_grow.vect[2] < nghost->vect[2])) {
    Assert_host("nghost.allLE(nGrowVect())",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_FabArray.H"
                ,0xa60,"\"FillBoundary: asked to fill more ghost cells than we have\"");
  }
  iVar2 = nghost->vect[1];
  if (nghost->vect[1] < nghost->vect[0]) {
    iVar2 = nghost->vect[0];
  }
  if (iVar2 <= nghost->vect[2]) {
    iVar2 = nghost->vect[2];
  }
  if (0 < iVar2) {
    FBEP_nowait<double,_amrex::FArrayBox,_0>(this,scomp,ncomp,nghost,period,cross,false,false);
  }
  return;
}

Assistant:

void
FabArray<FAB>::FillBoundary (int scomp, int ncomp, const IntVect& nghost,
                             const Periodicity& period, bool cross)
{
    BL_PROFILE("FabArray::FillBoundary()");
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(nghost.allLE(nGrowVect()),
                                     "FillBoundary: asked to fill more ghost cells than we have");
    if ( nghost.max() > 0 ) {
        FillBoundary_nowait<BUF>(scomp, ncomp, nghost, period, cross);
        FillBoundary_finish<BUF>();
    }
}